

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkGetClauseNum(Abc_Ntk_t *pNtk)

{
  DdManager *dd_00;
  DdNode *L;
  int iVar1;
  int local_44;
  int i;
  DdManager *dd;
  DdNode *bFunc;
  DdNode *zCover;
  DdNode *bCover;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAStack_10;
  int nClauses;
  Abc_Ntk_t *pNtk_local;
  
  pNode._4_4_ = 0;
  dd_00 = (DdManager *)pNtk->pManFunc;
  pAStack_10 = pNtk;
  iVar1 = Abc_NtkIsBddLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0x136,"int Abc_NtkGetClauseNum(Abc_Ntk_t *)");
  }
  local_44 = 0;
  do {
    iVar1 = Vec_PtrSize(pAStack_10->vObjs);
    if (iVar1 <= local_44) {
      return pNode._4_4_;
    }
    bCover = (DdNode *)Abc_NtkObj(pAStack_10,local_44);
    if (((Abc_Obj_t *)bCover != (Abc_Obj_t *)0x0) &&
       (iVar1 = Abc_ObjIsNode((Abc_Obj_t *)bCover), iVar1 != 0)) {
      if (bCover[1].type.kids.T == (DdNode *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                      ,0x139,"int Abc_NtkGetClauseNum(Abc_Ntk_t *)");
      }
      L = bCover[1].type.kids.T;
      zCover = Cudd_zddIsop(dd_00,L,L,&bFunc);
      Cudd_Ref(zCover);
      Cudd_Ref(bFunc);
      iVar1 = Abc_CountZddCubes(dd_00,bFunc);
      pNode._4_4_ = iVar1 + pNode._4_4_;
      Cudd_RecursiveDeref(dd_00,zCover);
      Cudd_RecursiveDerefZdd(dd_00,bFunc);
      zCover = Cudd_zddIsop(dd_00,(DdNode *)((ulong)L ^ 1),(DdNode *)((ulong)L ^ 1),&bFunc);
      Cudd_Ref(zCover);
      Cudd_Ref(bFunc);
      iVar1 = Abc_CountZddCubes(dd_00,bFunc);
      pNode._4_4_ = iVar1 + pNode._4_4_;
      Cudd_RecursiveDeref(dd_00,zCover);
      Cudd_RecursiveDerefZdd(dd_00,bFunc);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

int Abc_NtkGetClauseNum( Abc_Ntk_t * pNtk )
{
    int nClauses = 0;
#ifdef ABC_USE_CUDD
    extern int Abc_CountZddCubes( DdManager * dd, DdNode * zCover );
    Abc_Obj_t * pNode;
    DdNode * bCover, * zCover, * bFunc;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    int i;
    assert( Abc_NtkIsBddLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        bFunc = (DdNode *)pNode->pData;

        bCover = Cudd_zddIsop( dd, bFunc, bFunc, &zCover );  
        Cudd_Ref( bCover );
        Cudd_Ref( zCover );
        nClauses += Abc_CountZddCubes( dd, zCover );
        Cudd_RecursiveDeref( dd, bCover );
        Cudd_RecursiveDerefZdd( dd, zCover );

        bCover = Cudd_zddIsop( dd, Cudd_Not(bFunc), Cudd_Not(bFunc), &zCover );  
        Cudd_Ref( bCover );
        Cudd_Ref( zCover );
        nClauses += Abc_CountZddCubes( dd, zCover );
        Cudd_RecursiveDeref( dd, bCover );
        Cudd_RecursiveDerefZdd( dd, zCover );
    }
#endif
    return nClauses;
}